

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O0

void google::protobuf::json_internal::ParseProto3Type::
     SetInt<unsigned_long,(google::protobuf::Field_Kind)4,(google::protobuf::Field_Kind)6,(google::protobuf::Field_Kind)0>
               (Field f,Msg *msg,unsigned_long x)

{
  Field_Kind FVar1;
  int32_t iVar2;
  Field *pFVar3;
  uint64_t local_20;
  unsigned_long x_local;
  Msg *msg_local;
  Field f_local;
  
  RecordAsSeen(f,msg);
  pFVar3 = ResolverPool::Field::proto(f);
  FVar1 = Field::kind(pFVar3);
  if (FVar1 == Field_Kind_TYPE_UNKNOWN) {
    local_20 = internal::WireFormatLite::ZigZagEncode64(x);
  }
  else {
    local_20 = x;
    if (FVar1 != Field_Kind_TYPE_UINT64) {
      if (FVar1 != Field_Kind_TYPE_FIXED64) {
        return;
      }
      pFVar3 = ResolverPool::Field::proto(f);
      iVar2 = Field::number(pFVar3);
      io::CodedOutputStream::WriteTag(&msg->stream_,iVar2 << 3 | 1);
      io::CodedOutputStream::WriteLittleEndian64(&msg->stream_,x);
      return;
    }
  }
  pFVar3 = ResolverPool::Field::proto(f);
  iVar2 = Field::number(pFVar3);
  io::CodedOutputStream::WriteTag(&msg->stream_,iVar2 << 3);
  io::CodedOutputStream::WriteVarint64(&msg->stream_,local_20);
  return;
}

Assistant:

static void SetInt(Field f, Msg& msg, Int x) {
    RecordAsSeen(f, msg);
    switch (f->proto().kind()) {
      case zigzag:
        // Regardless of the integer type, ZigZag64 will do the right thing,
        // because ZigZag is not dependent on the width of the integer: it is
        // always `2 * abs(n) + (n < 0)`.
        x = static_cast<Int>(
            internal::WireFormatLite::ZigZagEncode64(static_cast<int64_t>(x)));
        ABSL_FALLTHROUGH_INTENDED;
      case varint:
        msg.stream_.WriteTag(f->proto().number() << 3 |
                             WireFormatLite::WIRETYPE_VARINT);
        if (sizeof(Int) == 4) {
          msg.stream_.WriteVarint32(static_cast<uint32_t>(x));
        } else {
          msg.stream_.WriteVarint64(static_cast<uint64_t>(x));
        }
        break;
      case fixed: {
        if (sizeof(Int) == 4) {
          msg.stream_.WriteTag(f->proto().number() << 3 |
                               WireFormatLite::WIRETYPE_FIXED32);
          msg.stream_.WriteLittleEndian32(static_cast<uint32_t>(x));
        } else {
          msg.stream_.WriteTag(f->proto().number() << 3 |
                               WireFormatLite::WIRETYPE_FIXED64);
          msg.stream_.WriteLittleEndian64(static_cast<uint64_t>(x));
        }
        break;
      }
      default: {  // Unreachable.
      }
    }
  }